

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qp2passes.hpp
# Opt level: O1

QP2PassNodeResult __thiscall mp::QP2PassVisitor::VisitDiv(QP2PassVisitor *this,BinaryExpr e)

{
  longdouble lVar1;
  int iVar2;
  ExprBase e_00;
  int iVar3;
  NumericConstant ec;
  Error *this_00;
  double dVar4;
  
  iVar2 = **(int **)((long)e.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.super_ExprBase.
                           impl_ + 0x10);
  dVar4 = 0.0;
  if (iVar2 == 1) {
    dVar4 = *(double *)
             (*(int **)((long)e.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.
                              super_ExprBase.impl_ + 0x10) + 2);
  }
  iVar3 = 1000;
  if (iVar2 == 1) {
    if ((dVar4 == 0.0) && (!NAN(dVar4))) {
      this_00 = (Error *)__cxa_allocate_exception(0x18);
      Error::Error(this_00,(CStringRef)0x381722,-1);
      __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
    }
    dVar4 = 1.0 / dVar4;
    if ((dVar4 != 0.0) || (NAN(dVar4))) {
      e_00.impl_ = ((ExprBase *)
                   ((long)e.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.super_ExprBase.
                          impl_ + 8))->impl_;
      lVar1 = this->factor_;
      this->factor_ = lVar1 * (longdouble)dVar4;
      iVar3 = BasicExprVisitor<mp::QP2PassVisitor,_int,_mp::internal::ExprTypes>::Visit
                        ((BasicExprVisitor<mp::QP2PassVisitor,_int,_mp::internal::ExprTypes> *)this,
                         (Expr)e_00.impl_);
      this->factor_ = lVar1;
    }
    else {
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

QP2PassNodeResult QP2PassVisitor::VisitDiv(BinaryExpr e) {
  auto isc = IsConst(e.rhs());
  if (isc.first) {
    if (!isc.second)
      MP_RAISE("Division by 0");
    return Visit(e.lhs(), 1.0/isc.second);
  }
  return 1000;
}